

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * os_get_fext(char *filepath)

{
  int iVar1;
  size_t sVar2;
  char *extstr;
  int32_t i;
  char *filepath_local;
  
  sVar2 = strlen(filepath);
  extstr._4_4_ = (int)sVar2;
  while( true ) {
    iVar1 = extstr._4_4_;
    extstr._4_4_ = iVar1 + -1;
    if (extstr._4_4_ < 0) {
      return (char *)0x0;
    }
    if ((filepath[extstr._4_4_] == '/') || (filepath[extstr._4_4_] == '\\')) break;
    if (filepath[extstr._4_4_] == '.') {
      return filepath + iVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *os_get_fext(const char *filepath) {

    for (int32_t i = strlen(filepath) - 1; i >= 0; i--) {
        if (filepath[i] == '/' || filepath[i] == '\\') {
            return NULL;
        } else if (filepath[i] == '.') {
            const char *extstr = &filepath[i + 1];
            return extstr;
        }
    }
    return NULL;
}